

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

bool __thiscall testing::internal::FilePath::IsRootDirectory(FilePath *this)

{
  if ((this->pathname_)._M_string_length == 1) {
    return *(this->pathname_)._M_dataplus._M_p == '/';
  }
  return false;
}

Assistant:

bool FilePath::IsRootDirectory() const {
#if GTEST_OS_WINDOWS
  // TODO(wan@google.com): on Windows a network share like
  // \\server\share can be a root directory, although it cannot be the
  // current directory.  Handle this properly.
  return pathname_.length() == 3 && IsAbsolutePath();
#else
  return pathname_.length() == 1 && IsPathSeparator(pathname_.c_str()[0]);
#endif
}